

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O1

void __thiscall
IMLE<1,_1,_FastLinearExpert>::predictInverseSingle(IMLE<1,_1,_FastLinearExpert> *this,X *x)

{
  pointer *ppMVar1;
  ArrayZ *this_00;
  ArrayZZ *this_01;
  double *pdVar2;
  pointer pMVar3;
  pointer pdVar4;
  iterator iVar5;
  pointer pFVar6;
  long lVar7;
  double *pdVar8;
  iterator iVar9;
  pointer piVar10;
  double dVar11;
  undefined1 auVar12 [16];
  int iVar13;
  double *pdVar14;
  undefined8 *puVar15;
  long lVar16;
  value_type *__x;
  ActualDstType actualDst_1;
  ulong uVar17;
  Index index_1;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  ActualDstType actualDst;
  ArrayScal *pAVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  plain_array<double,_1,_0,_0> local_48;
  ArrayScal *local_40;
  double local_38;
  
  local_38 = (this->zeroZZ).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.
             m_data.array[0];
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->sumInvRzj,1,1,1);
  lVar16 = (this->sumInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_cols *
           (this->sumInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_rows;
  if (0 < lVar16) {
    memset((this->sumInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data,0,lVar16 * 8);
  }
  pMVar3 = (this->invPredictions).
           super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           .
           super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->invPredictions).
      super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      .
      super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pMVar3) {
    (this->invPredictions).
    super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    .
    super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar3;
  }
  pMVar3 = (this->invPredictionsVar).
           super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           .
           super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->invPredictionsVar).
      super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      .
      super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pMVar3) {
    (this->invPredictionsVar).
    super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    .
    super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar3;
  }
  pdVar4 = (this->invPredictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->invPredictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar4) {
    (this->invPredictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar4;
  }
  if ((this->sum_p_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_rows != 1) {
    free((this->sum_p_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_data);
    pdVar14 = (double *)malloc(8);
    if (pdVar14 == (double *)0x0) goto LAB_00147fe8;
    (this->sum_p_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
         = pdVar14;
  }
  (this->sum_p_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       1;
  *(this->sum_p_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       0.0;
  pMVar3 = (this->iInvRj).
           super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           .
           super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->iInvRj).
      super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      .
      super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pMVar3) {
    (this->iInvRj).
    super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    .
    super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar3;
  }
  std::
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  ::reserve(&(this->iInvRj).
             super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
            ,(long)this->M);
  lVar16 = (long)this->M;
  if ((lVar16 != 0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar16),0) < 1)) {
LAB_00147fe8:
    puVar15 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar15 = operator_delete;
    __cxa_throw(puVar15,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->invRzj,lVar16,1,lVar16);
  iVar13 = this->M;
  lVar16 = (long)iVar13;
  if ((this->zInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_rows != lVar16) {
    free((this->zInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_data);
    if (iVar13 < 1) {
      pdVar14 = (double *)0x0;
    }
    else {
      pdVar14 = (double *)malloc(lVar16 * 8);
      if (pdVar14 == (double *)0x0) goto LAB_00147fe8;
    }
    (this->zInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
         = pdVar14;
  }
  (this->zInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       lVar16;
  iVar13 = this->M;
  if (0 < iVar13) {
    lVar21 = 0;
    lVar16 = 0;
    do {
      pAVar22 = (ArrayScal *)
                LinearExpert<1,_1>::queryX
                          (&(this->experts).
                            super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                            .
                            super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar16].
                            super_LinearExpert<1,_1>,x);
      local_48.array[0] =
           (double  [1])
           ((double)(this->experts).
                    super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                    .
                    super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar16].super_LinearExpert<1,_1>.
                    pred_z_invVar.super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
                    m_storage * (double)pAVar22);
      iVar5._M_current =
           (this->iInvRj).
           super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           .
           super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->iInvRj).
          super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
          .
          super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_40 = pAVar22;
        std::
        vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        ::_M_realloc_insert(&(this->iInvRj).
                             super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                            ,iVar5,(value_type *)&local_48);
        pAVar22 = local_40;
      }
      else {
        ((iVar5._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage
        .m_data.array[0] = (double)local_48.array[0];
        ppMVar1 = &(this->iInvRj).
                   super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                   .
                   super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppMVar1 = *ppMVar1 + 1;
      }
      auVar12 = _DAT_001670b0;
      pFVar6 = (this->experts).
               super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
               .
               super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pMVar3 = (this->iInvRj).
               super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
               .
               super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar14 = (this->invRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      lVar7 = (this->invRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_rows;
      if (0 < lVar7) {
        dVar26 = (double)pMVar3[lVar16].super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>
                         .m_storage *
                 (double)pFVar6[lVar16].super_LinearExpert<1,_1>.pred_z.
                         super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage;
        lVar20 = lVar7 + -1;
        auVar23._8_4_ = (int)lVar20;
        auVar23._0_8_ = lVar20;
        auVar23._12_4_ = (int)((ulong)lVar20 >> 0x20);
        auVar23 = auVar23 ^ _DAT_001670b0;
        uVar18 = 0;
        auVar24 = _DAT_001670a0;
        do {
          auVar25 = auVar24 ^ auVar12;
          if ((bool)(~(auVar23._4_4_ < auVar25._4_4_ ||
                      auVar23._0_4_ < auVar25._0_4_ && auVar25._4_4_ == auVar23._4_4_) & 1)) {
            *(double *)((long)pdVar14 + uVar18 * 8 + lVar7 * lVar21) = dVar26;
          }
          if (auVar25._12_4_ <= auVar23._12_4_ &&
              (auVar25._8_4_ <= auVar23._8_4_ || auVar25._12_4_ != auVar23._12_4_)) {
            *(double *)((long)pdVar14 + uVar18 * 8 + lVar7 * lVar21 + 8) = dVar26;
          }
          uVar18 = uVar18 + 2;
          lVar20 = auVar24._8_8_;
          auVar24._0_8_ = auVar24._0_8_ + 2;
          auVar24._8_8_ = lVar20 + 2;
        } while ((lVar7 + 1U & 0xfffffffffffffffe) != uVar18);
      }
      (this->zInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_data[lVar16] =
           (double)pFVar6[lVar16].super_LinearExpert<1,_1>.pred_z.
                   super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage *
           pdVar14[lVar7 * lVar16];
      pdVar8 = (this->sum_p_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      *pdVar8 = (double)pAVar22 + *pdVar8;
      local_38 = local_38 +
                 (double)pMVar3[lVar16].super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>
                         .m_storage;
      pdVar8 = (this->sumInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data;
      uVar18 = (this->sumInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
      uVar17 = uVar18;
      if ((((ulong)pdVar8 & 7) == 0) &&
         (uVar17 = (ulong)((uint)((ulong)pdVar8 >> 3) & 1), (long)uVar18 <= (long)uVar17)) {
        uVar17 = uVar18;
      }
      if (0 < (long)uVar17) {
        uVar19 = 0;
        do {
          pdVar8[uVar19] = *(double *)((long)pdVar14 + uVar19 * 8 + lVar7 * lVar21) + pdVar8[uVar19]
          ;
          uVar19 = uVar19 + 1;
        } while (uVar17 != uVar19);
      }
      lVar20 = uVar18 - uVar17;
      uVar19 = (lVar20 - (lVar20 >> 0x3f) & 0xfffffffffffffffeU) + uVar17;
      if (1 < lVar20) {
        do {
          pdVar2 = (double *)((long)pdVar14 + uVar17 * 8 + lVar7 * lVar21);
          dVar11 = pdVar2[1];
          dVar26 = (pdVar8 + uVar17)[1];
          pdVar8[uVar17] = *pdVar2 + pdVar8[uVar17];
          (pdVar8 + uVar17)[1] = dVar11 + dVar26;
          uVar17 = uVar17 + 2;
        } while ((long)uVar17 < (long)uVar19);
      }
      if ((long)uVar19 < (long)uVar18) {
        do {
          pdVar8[uVar19] = *(double *)((long)pdVar14 + uVar19 * 8 + lVar7 * lVar21) + pdVar8[uVar19]
          ;
          uVar19 = uVar19 + 1;
        } while (uVar18 != uVar19);
      }
      lVar16 = lVar16 + 1;
      iVar13 = this->M;
      lVar21 = lVar21 + 8;
    } while (lVar16 < iVar13);
  }
  this_00 = &this->invPredictions;
  this_01 = &this->invPredictionsVar;
  local_40 = &this->invPredictionsWeight;
  pdVar14 = (this->sum_p_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
            .m_data;
  this->sumAll = *pdVar14 + this->pNoiseModelX;
  dVar26 = *pdVar14;
  if ((dVar26 != 0.0) || (NAN(dVar26))) {
    dVar26 = (this->param).multiValuedSignificance;
    if ((dVar26 != 0.0) || (NAN(dVar26))) {
      dVar26 = 1.0 / local_38;
      local_48.array[0] =
           (double  [1])
           (*(this->sumInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data * dVar26);
      iVar5._M_current =
           (this->invPredictions).
           super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           .
           super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->invPredictions).
          super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
          .
          super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_38 = dVar26;
        std::
        vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        ::_M_realloc_insert(&this_00->
                             super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                            ,iVar5,(value_type *)&local_48);
        dVar26 = local_38;
      }
      else {
        ((iVar5._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage
        .m_data.array[0] = (double)local_48.array[0];
        ppMVar1 = &(this->invPredictions).
                   super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                   .
                   super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppMVar1 = *ppMVar1 + 1;
      }
      local_48.array[0] = (double  [1])(dVar26 * this->sumAll);
      iVar5._M_current =
           (this->invPredictionsVar).
           super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           .
           super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->invPredictionsVar).
          super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
          .
          super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        ::_M_realloc_insert(&this_01->
                             super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                            ,iVar5,(value_type *)&local_48);
      }
      else {
        ((iVar5._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage
        .m_data.array[0] = (double)local_48.array[0];
        ppMVar1 = &(this->invPredictionsVar).
                   super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                   .
                   super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppMVar1 = *ppMVar1 + 1;
      }
      local_48.array[0] =
           (double  [1])
           (*(this->sum_p_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data / this->sumAll);
      iVar9._M_current =
           (this->invPredictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar9._M_current ==
          (this->invPredictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert
                  (local_40,iVar9,local_48.array);
      }
      else {
        *iVar9._M_current = (double)local_48.array[0];
        (this->invPredictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar9._M_current + 1;
      }
      this->nInvSolFound = 1;
      piVar10 = (this->sNearestInv).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->sNearestInv).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar10) {
        (this->sNearestInv).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = piVar10;
      }
      std::vector<int,_std::allocator<int>_>::resize(&this->sNearestInv,(long)this->M,0);
    }
    else {
      std::
      vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ::reserve(&this_00->
                 super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                ,(long)iVar13);
      std::
      vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ::reserve(&this_01->
                 super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                ,(long)this->M);
      std::vector<double,_std::allocator<double>_>::reserve(local_40,(long)this->M);
      iVar13 = this->M;
      if (0 < iVar13) {
        lVar16 = 0;
        lVar21 = 0;
        do {
          __x = (value_type *)
                ((long)&(((this->experts).
                          super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                          .
                          super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->super_LinearExpert<1,_1>).
                        pred_z + lVar16);
          iVar5._M_current =
               (this->invPredictions).
               super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
               .
               super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->invPredictions).
              super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
              .
              super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
            ::_M_realloc_insert(&this_00->
                                 super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                                ,iVar5,__x);
          }
          else {
            ((iVar5._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).
            m_storage.m_data.array[0] =
                 (__x->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage.
                 m_data.array[0];
            ppMVar1 = &(this->invPredictions).
                       super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                       .
                       super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppMVar1 = *ppMVar1 + 1;
          }
          pFVar6 = (this->experts).
                   super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                   .
                   super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          dVar26 = *(double *)
                    ((long)&(pFVar6->super_LinearExpert<1,_1>).pred_x + lVar16 + 0xffffffffffffffd8U
                    );
          local_48.array[0] =
               (double  [1])
               (((this->pNoiseModelX + dVar26) *
                *(double *)((long)&(pFVar6->super_LinearExpert<1,_1>).pred_z_var + lVar16)) / dVar26
               );
          iVar5._M_current =
               (this->invPredictionsVar).
               super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
               .
               super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->invPredictionsVar).
              super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
              .
              super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
            ::_M_realloc_insert(&this_01->
                                 super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                                ,iVar5,(value_type *)&local_48);
          }
          else {
            ((iVar5._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).
            m_storage.m_data.array[0] = (double)local_48.array[0];
            ppMVar1 = &(this->invPredictionsVar).
                       super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                       .
                       super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppMVar1 = *ppMVar1 + 1;
          }
          local_48.array[0] =
               (double  [1])
               (*(double *)
                 ((long)&(((this->experts).
                           super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                           .
                           super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->super_LinearExpert<1,_1>).
                         pred_x + lVar16 + 0xffffffffffffffd8U) / this->sumAll);
          iVar9._M_current =
               (this->invPredictionsWeight).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar9._M_current ==
              (this->invPredictionsWeight).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert
                      (local_40,iVar9,local_48.array);
          }
          else {
            *iVar9._M_current = (double)local_48.array[0];
            (this->invPredictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl
            .super__Vector_impl_data._M_finish = iVar9._M_current + 1;
          }
          lVar21 = lVar21 + 1;
          iVar13 = this->M;
          lVar16 = lVar16 + 0x1a8;
        } while (lVar21 < iVar13);
      }
      this->nInvSolFound = iVar13;
    }
  }
  else {
    iVar5._M_current =
         (this->invPredictions).
         super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
         .
         super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (this->invPredictions).
        super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        .
        super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ::_M_realloc_insert(&this_00->
                           super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                          ,iVar5,&this->zeroZ);
    }
    else {
      ((iVar5._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage.
      m_data.array[0] =
           (this->zeroZ).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.
           m_data.array[0];
      ppMVar1 = &(this->invPredictions).
                 super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                 .
                 super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppMVar1 = *ppMVar1 + 1;
    }
    iVar5._M_current =
         (this->invPredictionsVar).
         super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
         .
         super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (this->invPredictionsVar).
        super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        .
        super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ::_M_realloc_insert(&this_01->
                           super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                          ,iVar5,&this->infinityZZ);
    }
    else {
      ((iVar5._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage.
      m_data.array[0] =
           (this->infinityZZ).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage
           .m_data.array[0];
      ppMVar1 = &(this->invPredictionsVar).
                 super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                 .
                 super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppMVar1 = *ppMVar1 + 1;
    }
    local_48.array[0] = (double  [1])0.0;
    iVar9._M_current =
         (this->invPredictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar9._M_current ==
        (this->invPredictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert(local_40,iVar9,local_48.array)
      ;
    }
    else {
      *iVar9._M_current = 0.0;
      (this->invPredictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar9._M_current + 1;
    }
    this->nInvSolFound = 1;
  }
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::predictInverseSingle(X const &x)
{
    // Aux variables
    ZZ sumInvRj = zeroZZ;
    sumInvRzj.setZero(d,1);

    // Clear predict data structure
    invPredictions.clear();
    invPredictionsVar.clear();
    invPredictionsWeight.clear();

    sum_p_x.resize(1);
    sum_p_x(0) = 0.0;
    iInvRj.clear(); iInvRj.reserve(M);
    invRzj.resize(d,M);
    zInvRzj.resize(M);

#ifdef IMLE_NO_TEMPLATES
    // Check dimensions
    if( x.size() != D )
    {
        message("IMLE::predict: query dimension does not match output dimension!!");

        sum_p_x.setZero(1);
    }
    else
#endif
        for(int j = 0; j < M; j++)
        {
            Scal p_x = experts[j].queryX(x);

            // These are needed for multivalued inverse prediction
            iInvRj.push_back(experts[j].getPredZInvVar() * p_x );
            invRzj.col(j) = iInvRj[j] * experts[j].getPredZ();
            zInvRzj(j) = experts[j].getPredZ().dot( invRzj.col(j) );

            sum_p_x(0) += p_x;
            sumInvRj += iInvRj[j];
            sumInvRzj.col(0) += invRzj.col(j);
        }
    sumAll = sum_p_x(0) + pNoiseModelX;

    if(sum_p_x(0) == 0.0)  // This happens when a prediction is sought too far from the current mixture
    {
        invPredictions.push_back(zeroZ);
        invPredictionsVar.push_back( infinityZZ );
        invPredictionsWeight.push_back(0.0);

        nInvSolFound = 1;
        return;
    }
    else if( param.multiValuedSignificance == 0.0 )
    {
        invPredictions.reserve(M);
        invPredictionsVar.reserve(M);
        invPredictionsWeight.reserve(M);

        for(int j = 0; j < M; j++)
        {
            invPredictions.push_back( experts[j].getPredZ() );
            invPredictionsVar.push_back( experts[j].getPredZVar() *(experts[j].get_p_x() + pNoiseModelX) / experts[j].get_p_x() );
            invPredictionsWeight.push_back(experts[j].get_p_x() / sumAll);
        }

        nInvSolFound = M;
        return;
    }
    else
    {
        ZZ invVar = sumInvRj.inverse();

        invPredictions.push_back( invVar * sumInvRzj.col(0) );
        invPredictionsVar.push_back( invVar * sumAll );
        invPredictionsWeight.push_back(sum_p_x(0) / sumAll );
    }

    nInvSolFound = 1;
    sNearestInv.clear();
    sNearestInv.resize(M,0);
}